

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XSDDOMParser::docComment(XSDDOMParser *this,XMLCh *comment)

{
  XMLBuffer *this_00;
  XMLSize_t XVar1;
  XMLCh *pXVar2;
  XMLSize_t XVar3;
  XMLSize_t XVar4;
  
  if (-1 < this->fAnnotationDepth) {
    this_00 = &this->fAnnotationBuf;
    XMLBuffer::append(this_00,(XMLCh *)XMLUni::fgCommentString);
    XMLBuffer::append(this_00,comment);
    XVar4 = (this->fAnnotationBuf).fIndex;
    XVar1 = (this->fAnnotationBuf).fCapacity;
    if (XVar4 == XVar1) {
      XMLBuffer::ensureCapacity(this_00,1);
      XVar4 = (this->fAnnotationBuf).fIndex;
      XVar1 = (this->fAnnotationBuf).fCapacity;
    }
    pXVar2 = (this->fAnnotationBuf).fBuffer;
    XVar3 = XVar4 + 1;
    (this->fAnnotationBuf).fIndex = XVar3;
    pXVar2[XVar4] = L'-';
    if (XVar3 == XVar1) {
      XMLBuffer::ensureCapacity(this_00,1);
      XVar3 = (this->fAnnotationBuf).fIndex;
      XVar1 = (this->fAnnotationBuf).fCapacity;
      pXVar2 = (this->fAnnotationBuf).fBuffer;
    }
    XVar4 = XVar3 + 1;
    this_00->fIndex = XVar4;
    pXVar2[XVar3] = L'-';
    if (XVar4 == XVar1) {
      XMLBuffer::ensureCapacity(this_00,1);
      XVar4 = (this->fAnnotationBuf).fIndex;
      pXVar2 = (this->fAnnotationBuf).fBuffer;
    }
    this_00->fIndex = XVar4 + 1;
    pXVar2[XVar4] = L'>';
  }
  return;
}

Assistant:

void XSDDOMParser::docComment(const XMLCh* const comment)
{
    if (fAnnotationDepth > -1)
    {
        fAnnotationBuf.append(XMLUni::fgCommentString);
        fAnnotationBuf.append(comment);
        fAnnotationBuf.append(chDash);
        fAnnotationBuf.append(chDash);
        fAnnotationBuf.append(chCloseAngle);
    }
}